

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

QString * __thiscall
QSqlRelationalTableModel::orderByClause
          (QString *__return_storage_ptr__,QSqlRelationalTableModel *this)

{
  long lVar1;
  QSqlRelationalTableModelPrivate *this_00;
  long in_FS_OFFSET;
  QSqlRelation rel;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QSqlRelation local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_78.dColumn.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.dColumn.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.dColumn.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.iColumn.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.iColumn.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.tName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.iColumn.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.tName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.tName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QSharedPointer<QRelation>_>::value
            ((QList<QSharedPointer<QRelation>_> *)&local_98,lVar1 + 0x2e8);
  if (local_98.d == (Data *)0x0) {
    local_78.dColumn.d.d = (Data *)0x0;
    local_78.dColumn.d.ptr = (char16_t *)0x0;
    local_78.iColumn.d.ptr = (char16_t *)0x0;
    local_78.iColumn.d.size = 0;
    local_78.tName.d.size = 0;
    local_78.iColumn.d.d = (Data *)0x0;
    local_78.tName.d.d = (Data *)0x0;
    local_78.tName.d.ptr = (char16_t *)0x0;
    local_78.dColumn.d.size = 0;
  }
  else {
    QSqlRelation::QSqlRelation
              (&local_78,
               *(QSqlRelation **)(*(long *)(lVar1 + 0x2f0) + (long)*(int *)(lVar1 + 0x230) * 0x10));
  }
  QSharedPointer<QRelation>::deref((Data *)local_98.ptr);
  if ((((undefined1 *)local_78.tName.d.size == (undefined1 *)0x0) ||
      ((undefined1 *)local_78.iColumn.d.size == (undefined1 *)0x0)) ||
     ((undefined1 *)local_78.dColumn.d.size == (undefined1 *)0x0)) {
    QSqlTableModel::orderByClause(__return_storage_ptr__,(QSqlTableModel *)this);
  }
  else {
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QSqlRelationalTableModelPrivate *)(ulong)*(uint *)(lVar1 + 0x230);
    QSqlRelationalTableModelSql::relTablePrefix((QString *)&local_b0,*(uint *)(lVar1 + 0x230));
    local_c8.d = local_78.dColumn.d.d;
    local_c8.ptr = local_78.dColumn.d.ptr;
    local_c8.size = local_78.dColumn.d.size;
    if (local_78.dColumn.d.d != (Data *)0x0) {
      LOCK();
      ((local_78.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
              ((QString *)&local_98,this_00,(QString *)&local_b0,(QString *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    if (*(int *)(lVar1 + 0x234) == 0) {
      QSqlQueryModelSql::asc((QString *)&local_b0,(QString *)&local_98);
    }
    else {
      QSqlQueryModelSql::desc((QString *)&local_b0,(QString *)&local_98);
    }
    QString::operator=((QString *)&local_98,(QString *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QSqlQueryModelSql::orderBy(__return_storage_ptr__,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  QSqlRelation::~QSqlRelation(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlRelationalTableModel::orderByClause() const
{
    Q_D(const QSqlRelationalTableModel);

    const QSqlRelation rel = d->relations.value(d->sortColumn) ? d->relations.at(d->sortColumn)->rel : QSqlRelation();
    if (!rel.isValid())
        return QSqlTableModel::orderByClause();

    QString f = d->fullyQualifiedFieldName(SqlrTm::relTablePrefix(d->sortColumn), rel.displayColumn());
    f = d->sortOrder == Qt::AscendingOrder ? SqlrTm::asc(f) : SqlrTm::desc(f);
    return SqlrTm::orderBy(f);
}